

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

uchar __thiscall Map::GenerateNPCIndex(Map *this)

{
  pointer ppNVar1;
  uchar uVar2;
  const_iterator __end1;
  pointer ppNVar3;
  
  uVar2 = '\x01';
  ppNVar1 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (ppNVar3 = ppNVar1;
      ppNVar3 !=
      (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data
      ._M_finish; ppNVar3 = ppNVar3 + 1) {
    for (; (*ppNVar3)->index == uVar2; uVar2 = uVar2 + '\x01') {
      ppNVar3 = ppNVar1;
    }
  }
  return uVar2;
}

Assistant:

unsigned char Map::GenerateNPCIndex() const
{
	unsigned char lowest_free_id = 1;
	restart_loop:
	UTIL_FOREACH(this->npcs, npc)
	{
		if (npc->index == lowest_free_id)
		{
			lowest_free_id = npc->index + 1;
			goto restart_loop;
		}
	}
	return lowest_free_id;
}